

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gop_structure.c
# Opt level: O1

void set_multi_layer_params
               (TWO_PASS *twopass,TWO_PASS_FRAME *twopass_frame,GF_GROUP *gf_group,
               PRIMARY_RATE_CONTROL *p_rc,RATE_CONTROL *rc,FRAME_INFO *frame_info,int start,int end,
               int *cur_frame_idx,int *frame_ind,int *parallel_frame_count,int max_parallel_frames,
               int do_frame_parallel_encode,int *first_frame_index,int *cur_disp_idx,int layer_depth
               )

{
  int iVar1;
  int iVar2;
  int *cur_disp_idx_00;
  int iVar3;
  int iVar4;
  int *piVar5;
  FRAME_INFO *frame_info_00;
  undefined4 in_stack_00000014;
  undefined4 in_stack_0000003c;
  int iVar6;
  
  frame_info_00 = (FRAME_INFO *)((ulong)frame_info & 0xffffffff);
  cur_disp_idx_00 = (int *)((ulong)cur_disp_idx & 0xffffffff);
  piVar5 = (int *)CONCAT44(in_stack_00000014,end);
  while( true ) {
    iVar4 = (int)cur_disp_idx_00;
    iVar2 = (int)frame_info_00;
    if ((gf_group->max_layer_depth_allowed < iVar4) || (start - iVar2 < 3)) break;
    iVar3 = ((iVar2 + start) - (iVar2 + start + -1 >> 0x1f)) + -1 >> 1;
    gf_group->update_type[*cur_frame_idx] = '\x06';
    gf_group->arf_src_offset[*cur_frame_idx] = (uchar)(iVar3 - iVar2);
    gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar5;
    gf_group->display_idx[*cur_frame_idx] =
         (uint)gf_group->arf_src_offset[*cur_frame_idx] + *first_frame_index;
    gf_group->layer_depth[*cur_frame_idx] = iVar4;
    gf_group->frame_type[*cur_frame_idx] = '\x01';
    gf_group->refbuf_state[*cur_frame_idx] = '\x01';
    if ((max_parallel_frames != 0) && (*frame_ind <= (int)parallel_frame_count && 1 < *frame_ind)) {
      if (gf_group->arf_src_offset[*cur_frame_idx] < 7) {
        gf_group->frame_parallel_level[*cur_frame_idx] = 2;
      }
      *frame_ind = 1;
    }
    iVar6 = *cur_frame_idx;
    if (0 < gf_group->frame_parallel_level[iVar6]) {
      iVar1 = *piVar5;
      if (gf_group->frame_parallel_level[iVar6] == 1) {
        *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar1;
      }
      gf_group->src_offset[iVar6] =
           (iVar1 + (uint)gf_group->arf_src_offset[iVar6]) -
           *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
    }
    iVar6 = 0;
    iVar2 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,iVar3,start - iVar3,
                               iVar3 - iVar2,(int *)0x0,(int *)0x0,0);
    gf_group->arf_boost[*cur_frame_idx] = iVar2;
    *cur_frame_idx = *cur_frame_idx + 1;
    cur_disp_idx_00 = (int *)(ulong)(iVar4 + 1);
    set_multi_layer_params
              (twopass,twopass_frame,gf_group,p_rc,rc,frame_info_00,iVar3,end,cur_frame_idx,
               frame_ind,(int *)((ulong)parallel_frame_count & 0xffffffff),max_parallel_frames,
               do_frame_parallel_encode,first_frame_index,cur_disp_idx_00,iVar6);
    piVar5 = (int *)CONCAT44(in_stack_00000014,end);
    gf_group->update_type[*cur_frame_idx] = '\x05';
    gf_group->arf_src_offset[*cur_frame_idx] = '\0';
    gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar5;
    gf_group->display_idx[*cur_frame_idx] = *first_frame_index;
    gf_group->arf_boost[*cur_frame_idx] = 0;
    gf_group->layer_depth[*cur_frame_idx] = iVar4;
    gf_group->frame_type[*cur_frame_idx] = '\x01';
    gf_group->refbuf_state[*cur_frame_idx] = '\x01';
    iVar4 = *cur_frame_idx;
    if (0 < gf_group->frame_parallel_level[iVar4]) {
      iVar2 = *piVar5;
      if (gf_group->frame_parallel_level[iVar4] == 1) {
        *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar2;
      }
      gf_group->src_offset[iVar4] =
           (iVar2 + (uint)gf_group->arf_src_offset[iVar4]) -
           *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
    }
    *cur_frame_idx = *cur_frame_idx + 1;
    *piVar5 = *piVar5 + 1;
    *first_frame_index = *first_frame_index + 1;
    frame_info_00 = (FRAME_INFO *)(ulong)(iVar3 + 1);
  }
  iVar3 = start - iVar2;
  if (iVar3 != 0 && iVar2 <= start) {
    do {
      gf_group->update_type[*cur_frame_idx] = '\x01';
      gf_group->arf_src_offset[*cur_frame_idx] = '\0';
      gf_group->cur_frame_idx[*cur_frame_idx] = (uchar)*piVar5;
      gf_group->display_idx[*cur_frame_idx] = *first_frame_index;
      gf_group->layer_depth[*cur_frame_idx] = 6;
      iVar2 = av1_calc_arf_boost(twopass,twopass_frame,p_rc,(FRAME_INFO *)rc,(int)frame_info_00,
                                 iVar3,0,(int *)0x0,(int *)0x0,0);
      gf_group->arf_boost[*cur_frame_idx] = iVar2;
      gf_group->frame_type[*cur_frame_idx] = '\x01';
      gf_group->refbuf_state[*cur_frame_idx] = '\x01';
      iVar2 = gf_group->max_layer_depth;
      if (gf_group->max_layer_depth <= iVar4) {
        iVar2 = iVar4;
      }
      gf_group->max_layer_depth = iVar2;
      if (max_parallel_frames != 0) {
        gf_group->frame_parallel_level[*cur_frame_idx] = (1 < *frame_ind) + 1;
        iVar2 = *frame_ind + 1;
        if ((int)parallel_frame_count <= *frame_ind) {
          iVar2 = 1;
        }
        *frame_ind = iVar2;
        gf_group->is_frame_non_ref[*cur_frame_idx] = true;
      }
      iVar2 = *cur_frame_idx;
      piVar5 = (int *)CONCAT44(in_stack_00000014,end);
      if (0 < gf_group->frame_parallel_level[iVar2]) {
        iVar6 = *piVar5;
        if (gf_group->frame_parallel_level[iVar2] == 1) {
          *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode) = iVar6;
        }
        gf_group->src_offset[iVar2] =
             (iVar6 + (uint)gf_group->arf_src_offset[iVar2]) -
             *(int *)CONCAT44(in_stack_0000003c,do_frame_parallel_encode);
      }
      *cur_frame_idx = *cur_frame_idx + 1;
      *piVar5 = *piVar5 + 1;
      *first_frame_index = *first_frame_index + 1;
      frame_info_00 = (FRAME_INFO *)(ulong)((int)frame_info_00 + 1);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

static void set_multi_layer_params(
    const TWO_PASS *twopass, const TWO_PASS_FRAME *twopass_frame,
    GF_GROUP *const gf_group, const PRIMARY_RATE_CONTROL *p_rc,
    RATE_CONTROL *rc, FRAME_INFO *frame_info, int start, int end,
    int *cur_frame_idx, int *frame_ind, int *parallel_frame_count,
    int max_parallel_frames, int do_frame_parallel_encode,
    int *first_frame_index, int *cur_disp_idx, int layer_depth) {
  const int num_frames_to_process = end - start;

  // Either we are at the last level of the pyramid, or we don't have enough
  // frames between 'l' and 'r' to create one more level.
  if (layer_depth > gf_group->max_layer_depth_allowed ||
      num_frames_to_process < 3) {
    // Leaf nodes.
    while (start < end) {
      gf_group->update_type[*frame_ind] = LF_UPDATE;
      gf_group->arf_src_offset[*frame_ind] = 0;
      gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
      gf_group->display_idx[*frame_ind] = *cur_disp_idx;
      gf_group->layer_depth[*frame_ind] = MAX_ARF_LAYERS;
      gf_group->arf_boost[*frame_ind] =
          av1_calc_arf_boost(twopass, twopass_frame, p_rc, frame_info, start,
                             end - start, 0, NULL, NULL, 0);
      gf_group->frame_type[*frame_ind] = INTER_FRAME;
      gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;
      gf_group->max_layer_depth =
          AOMMAX(gf_group->max_layer_depth, layer_depth);
      // Set the level of parallelism for the LF_UPDATE frame.
      if (do_frame_parallel_encode) {
        set_frame_parallel_level(&gf_group->frame_parallel_level[*frame_ind],
                                 parallel_frame_count, max_parallel_frames);
        // Set LF_UPDATE frames as non-reference frames.
        gf_group->is_frame_non_ref[*frame_ind] = true;
      }
      set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);
      ++(*frame_ind);
      ++(*cur_frame_idx);
      ++(*cur_disp_idx);
      ++start;
    }
  } else {
    const int m = (start + end - 1) / 2;

    // Internal ARF.
    gf_group->update_type[*frame_ind] = INTNL_ARF_UPDATE;
    gf_group->arf_src_offset[*frame_ind] = m - start;
    gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
    gf_group->display_idx[*frame_ind] =
        *cur_disp_idx + gf_group->arf_src_offset[*frame_ind];
    gf_group->layer_depth[*frame_ind] = layer_depth;
    gf_group->frame_type[*frame_ind] = INTER_FRAME;
    gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;

    if (do_frame_parallel_encode) {
      // If max_parallel_frames is not exceeded and if the frame will not be
      // temporally filtered, encode the next internal ARF frame in parallel.
      if (*parallel_frame_count > 1 &&
          *parallel_frame_count <= max_parallel_frames) {
        if (gf_group->arf_src_offset[*frame_ind] < TF_LOOKAHEAD_IDX_THR)
          gf_group->frame_parallel_level[*frame_ind] = 2;
        *parallel_frame_count = 1;
      }
    }
    set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);

    // Get the boost factor for intermediate ARF frames.
    gf_group->arf_boost[*frame_ind] =
        av1_calc_arf_boost(twopass, twopass_frame, p_rc, frame_info, m, end - m,
                           m - start, NULL, NULL, 0);
    ++(*frame_ind);

    // Frames displayed before this internal ARF.
    set_multi_layer_params(twopass, twopass_frame, gf_group, p_rc, rc,
                           frame_info, start, m, cur_frame_idx, frame_ind,
                           parallel_frame_count, max_parallel_frames,
                           do_frame_parallel_encode, first_frame_index,
                           cur_disp_idx, layer_depth + 1);

    // Overlay for internal ARF.
    gf_group->update_type[*frame_ind] = INTNL_OVERLAY_UPDATE;
    gf_group->arf_src_offset[*frame_ind] = 0;
    gf_group->cur_frame_idx[*frame_ind] = *cur_frame_idx;
    gf_group->display_idx[*frame_ind] = *cur_disp_idx;
    gf_group->arf_boost[*frame_ind] = 0;
    gf_group->layer_depth[*frame_ind] = layer_depth;
    gf_group->frame_type[*frame_ind] = INTER_FRAME;
    gf_group->refbuf_state[*frame_ind] = REFBUF_UPDATE;

    set_src_offset(gf_group, first_frame_index, *cur_frame_idx, *frame_ind);
    ++(*frame_ind);
    ++(*cur_frame_idx);
    ++(*cur_disp_idx);

    // Frames displayed after this internal ARF.
    set_multi_layer_params(twopass, twopass_frame, gf_group, p_rc, rc,
                           frame_info, m + 1, end, cur_frame_idx, frame_ind,
                           parallel_frame_count, max_parallel_frames,
                           do_frame_parallel_encode, first_frame_index,
                           cur_disp_idx, layer_depth + 1);
  }
}